

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O0

void nestl::test::detail::print_tuple<char_const(&)[38],int&,char_const(&)[10],int&>
               (ostream *ostream,char (*args) [38],int *args_1,char (*args_2) [10],int *args_3)

{
  tuple<const_char_*,_int,_const_char_*,_int> local_50;
  int *local_30;
  int *args_local_3;
  char (*args_local_2) [10];
  int *args_local_1;
  char (*args_local) [38];
  ostream *ostream_local;
  
  local_30 = args_3;
  args_local_3 = (int *)args_2;
  args_local_2 = (char (*) [10])args_1;
  args_local_1 = (int *)args;
  args_local = (char (*) [38])ostream;
  std::make_tuple<char_const(&)[38],int&,char_const(&)[10],int&>
            (&local_50,args,args_1,args_2,args_3);
  print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*,int,char_const*,int>,0ul,1ul,2ul,3ul>
            (ostream,&local_50);
  return;
}

Assistant:

void print_tuple(std::ostream& ostream, Args&&... args)
{
    print_tuple_impl(ostream, std::make_tuple(args...), gen_seq<sizeof...(Args)>());
}